

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void divide_subset_split<float,unsigned_long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double split_point,MissingAction missing_action,
               size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  size_t *r;
  ulong *puVar5;
  ulong *puVar6;
  bool bVar7;
  size_t *psVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  uVar9 = Xc_indptr[col_num];
  uVar3 = Xc_indptr[col_num + 1];
  if (uVar9 == uVar3) {
    sVar10 = end + 1;
    if (split_point < 0.0) {
      sVar10 = st;
    }
    psVar8 = split_ix;
    if (missing_action != Fail) {
      *st_NA = sVar10;
      psVar8 = end_NA;
    }
    *psVar8 = sVar10;
  }
  puVar1 = ix_arr + st;
  puVar12 = ix_arr + end + 1;
  uVar13 = (long)puVar12 - (long)puVar1 >> 3;
  puVar6 = puVar1;
  if (0 < (long)uVar13) {
    do {
      uVar18 = uVar13 >> 1;
      uVar17 = ~uVar18 + uVar13;
      uVar13 = uVar18;
      if (puVar6[uVar18] < Xc_ind[uVar9]) {
        puVar6 = puVar6 + uVar18 + 1;
        uVar13 = uVar17;
      }
    } while (0 < (long)uVar13);
  }
  uVar13 = uVar3 - 1;
  sVar10 = (long)puVar6 - (long)ix_arr >> 3;
  if (puVar6 <= puVar1) {
    sVar10 = st;
  }
  uVar17 = Xc_ind[uVar3 - 1];
  puVar1 = ix_arr + end;
  if (split_point < 0.0) {
    sVar10 = st;
  }
  if (missing_action == Fail) {
    if (split_point < 0.0) {
      if (uVar9 != uVar3 && puVar6 != puVar12) {
        while (uVar18 = *puVar6, uVar18 <= uVar17) {
          puVar2 = Xc_ind + uVar9;
          uVar14 = *puVar2;
          if (uVar14 == uVar18) {
            if ((double)Xc[uVar9] <= split_point) {
              uVar14 = ix_arr[sVar10];
              ix_arr[sVar10] = uVar18;
              *puVar6 = uVar14;
              sVar10 = sVar10 + 1;
            }
            if ((puVar6 == puVar1) || (uVar9 == uVar13)) break;
            puVar5 = puVar2 + 1;
            puVar6 = puVar6 + 1;
            uVar9 = (long)((long)Xc_ind + (uVar3 * 8 - (long)puVar5)) >> 3;
            if (0 < (long)uVar9) {
              do {
                uVar18 = uVar9 >> 1;
                uVar14 = ~uVar18 + uVar9;
                uVar9 = uVar18;
                if (puVar5[uVar18] < *puVar6) {
                  puVar5 = puVar5 + uVar18 + 1;
                  uVar9 = uVar14;
                }
              } while (0 < (long)uVar9);
            }
LAB_002efcc6:
            uVar9 = (long)puVar5 - (long)Xc_ind >> 3;
          }
          else {
            if (uVar14 <= uVar18) {
              puVar5 = puVar2 + 1;
              uVar9 = (long)((long)Xc_ind + (uVar3 * 8 - (long)(puVar2 + 1))) >> 3;
              while (0 < (long)uVar9) {
                uVar14 = uVar9 >> 1;
                uVar15 = ~uVar14 + uVar9;
                uVar9 = uVar14;
                if (puVar5[uVar14] < uVar18) {
                  puVar5 = puVar5 + uVar14 + 1;
                  uVar9 = uVar15;
                }
              }
              goto LAB_002efcc6;
            }
            puVar6 = puVar6 + 1;
            uVar18 = (long)puVar12 - (long)puVar6 >> 3;
            while (0 < (long)uVar18) {
              uVar15 = uVar18 >> 1;
              uVar11 = ~uVar15 + uVar18;
              uVar18 = uVar15;
              if (puVar6[uVar15] < uVar14) {
                puVar6 = puVar6 + uVar15 + 1;
                uVar18 = uVar11;
              }
            }
          }
          if ((puVar6 == puVar12) || (uVar9 == uVar3)) break;
        }
      }
    }
    else {
      while (puVar6 != puVar12) {
        if (uVar3 <= uVar9) goto LAB_002ef824;
        puVar2 = Xc_ind + uVar9;
        uVar17 = *puVar6;
        if (*puVar2 == uVar17) {
          if ((double)Xc[uVar9] <= split_point) {
            uVar18 = ix_arr[sVar10];
            ix_arr[sVar10] = uVar17;
            *puVar6 = uVar18;
            sVar10 = sVar10 + 1;
          }
          if (((puVar6 < puVar1) && (puVar5 = puVar6 + 1, puVar5 <= puVar1)) && (uVar9 == uVar13)) {
            do {
              uVar17 = ix_arr[sVar10];
              ix_arr[sVar10] = *puVar5;
              *puVar5 = uVar17;
              sVar10 = sVar10 + 1;
              puVar5 = puVar5 + 1;
            } while (puVar5 <= puVar1);
          }
          if ((uVar9 == uVar13) || (puVar6 == puVar1)) break;
          puVar5 = puVar2 + 1;
          puVar6 = puVar6 + 1;
          uVar9 = (long)((long)Xc_ind + (uVar3 * 8 - (long)puVar5)) >> 3;
          if (0 < (long)uVar9) {
            do {
              uVar17 = uVar9 >> 1;
              uVar18 = ~uVar17 + uVar9;
              uVar9 = uVar17;
              if (puVar5[uVar17] < *puVar6) {
                puVar5 = puVar5 + uVar17 + 1;
                uVar9 = uVar18;
              }
            } while (0 < (long)uVar9);
          }
LAB_002ef7f7:
          uVar9 = (long)puVar5 - (long)Xc_ind >> 3;
        }
        else {
          if (*puVar2 <= uVar17) {
            puVar5 = puVar2 + 1;
            uVar9 = (long)((long)Xc_ind + (uVar3 * 8 - (long)(puVar2 + 1))) >> 3;
            while (0 < (long)uVar9) {
              uVar18 = uVar9 >> 1;
              uVar14 = ~uVar18 + uVar9;
              uVar9 = uVar18;
              if (puVar5[uVar18] < uVar17) {
                puVar5 = puVar5 + uVar18 + 1;
                uVar9 = uVar14;
              }
            }
            goto LAB_002ef7f7;
          }
          for (; (puVar6 <= puVar1 && (*puVar6 < *puVar2)); puVar6 = puVar6 + 1) {
            uVar17 = ix_arr[sVar10];
            ix_arr[sVar10] = *puVar6;
            *puVar6 = uVar17;
            sVar10 = sVar10 + 1;
          }
        }
      }
    }
    goto LAB_002ef8d1;
  }
  if (split_point < 0.0) {
    if (uVar9 != uVar3 && puVar6 != puVar12) {
      bVar7 = false;
      uVar18 = uVar9;
      while (uVar14 = *puVar6, uVar14 <= uVar17) {
        puVar2 = Xc_ind + uVar18;
        uVar15 = *puVar2;
        if (uVar15 == uVar14) {
          if (NAN(Xc[uVar18])) {
            bVar7 = true;
          }
          else if ((double)Xc[uVar18] <= split_point) {
            uVar15 = ix_arr[sVar10];
            ix_arr[sVar10] = uVar14;
            *puVar6 = uVar15;
            sVar10 = sVar10 + 1;
          }
          if ((puVar6 == puVar1) || (uVar18 == uVar13)) break;
          puVar5 = puVar2 + 1;
          puVar6 = puVar6 + 1;
          uVar18 = (long)((long)Xc_ind + (uVar3 * 8 - (long)puVar5)) >> 3;
          if (0 < (long)uVar18) {
            do {
              uVar14 = uVar18 >> 1;
              uVar15 = ~uVar14 + uVar18;
              uVar18 = uVar14;
              if (puVar5[uVar14] < *puVar6) {
                puVar5 = puVar5 + uVar14 + 1;
                uVar18 = uVar15;
              }
            } while (0 < (long)uVar18);
          }
LAB_002efa1f:
          uVar18 = (long)puVar5 - (long)Xc_ind >> 3;
        }
        else {
          if (uVar15 <= uVar14) {
            puVar5 = puVar2 + 1;
            uVar18 = (long)((long)Xc_ind + (uVar3 * 8 - (long)(puVar2 + 1))) >> 3;
            while (0 < (long)uVar18) {
              uVar15 = uVar18 >> 1;
              uVar11 = ~uVar15 + uVar18;
              uVar18 = uVar15;
              if (puVar5[uVar15] < uVar14) {
                puVar5 = puVar5 + uVar15 + 1;
                uVar18 = uVar11;
              }
            }
            goto LAB_002efa1f;
          }
          puVar6 = puVar6 + 1;
          uVar14 = (long)puVar12 - (long)puVar6 >> 3;
          while (0 < (long)uVar14) {
            uVar11 = uVar14 >> 1;
            uVar16 = ~uVar11 + uVar14;
            uVar14 = uVar11;
            if (puVar6[uVar11] < uVar15) {
              puVar6 = puVar6 + uVar11 + 1;
              uVar14 = uVar16;
            }
          }
        }
        if ((puVar6 == puVar12) || (uVar18 == uVar3)) break;
      }
      goto LAB_002ef846;
    }
  }
  else if (puVar6 != puVar12) {
    bVar7 = false;
    uVar18 = uVar9;
    do {
      if (uVar3 <= uVar18) goto LAB_002ef69d;
      puVar2 = Xc_ind + uVar18;
      uVar14 = *puVar6;
      if (*puVar2 == uVar14) {
        if (NAN(Xc[uVar18])) {
          bVar7 = true;
        }
        else if ((double)Xc[uVar18] <= split_point) {
          uVar15 = ix_arr[sVar10];
          ix_arr[sVar10] = uVar14;
          *puVar6 = uVar15;
          sVar10 = sVar10 + 1;
        }
        if (((puVar6 < puVar1) && (puVar5 = puVar6 + 1, puVar5 <= puVar1)) && (uVar18 == uVar13)) {
          do {
            uVar14 = ix_arr[sVar10];
            ix_arr[sVar10] = *puVar5;
            *puVar5 = uVar14;
            sVar10 = sVar10 + 1;
            puVar5 = puVar5 + 1;
          } while (puVar5 <= puVar1);
        }
        if ((uVar18 == uVar13) || (puVar6 == puVar1)) break;
        puVar5 = puVar2 + 1;
        puVar6 = puVar6 + 1;
        uVar18 = (long)((long)Xc_ind + (uVar3 * 8 - (long)puVar5)) >> 3;
        if (0 < (long)uVar18) {
          do {
            uVar14 = uVar18 >> 1;
            uVar15 = ~uVar14 + uVar18;
            uVar18 = uVar14;
            if (puVar5[uVar14] < *puVar6) {
              puVar5 = puVar5 + uVar14 + 1;
              uVar18 = uVar15;
            }
          } while (0 < (long)uVar18);
        }
LAB_002ef664:
        uVar18 = (long)puVar5 - (long)Xc_ind >> 3;
      }
      else {
        if (*puVar2 <= uVar14) {
          puVar5 = puVar2 + 1;
          uVar18 = (long)((long)Xc_ind + (uVar3 * 8 - (long)(puVar2 + 1))) >> 3;
          while (0 < (long)uVar18) {
            uVar15 = uVar18 >> 1;
            uVar11 = ~uVar15 + uVar18;
            uVar18 = uVar15;
            if (puVar5[uVar15] < uVar14) {
              puVar5 = puVar5 + uVar15 + 1;
              uVar18 = uVar11;
            }
          }
          goto LAB_002ef664;
        }
        for (; (puVar6 <= puVar1 && (*puVar6 < *puVar2)); puVar6 = puVar6 + 1) {
          uVar14 = ix_arr[sVar10];
          ix_arr[sVar10] = *puVar6;
          *puVar6 = uVar14;
          sVar10 = sVar10 + 1;
        }
      }
    } while (puVar6 != puVar12);
    goto LAB_002ef846;
  }
  bVar7 = false;
LAB_002ef846:
  *st_NA = sVar10;
  if (bVar7) {
    puVar6 = ix_arr + sVar10;
    if (puVar6 != puVar12) {
      uVar18 = (long)puVar12 - (long)puVar6 >> 3;
      lVar4 = 0x3f;
      if (uVar18 != 0) {
        for (; uVar18 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar6,puVar12,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(puVar6,puVar12);
    }
    if (uVar9 != uVar3 && puVar6 != puVar12) {
      while (uVar18 = *puVar6, uVar18 <= uVar17) {
        puVar2 = Xc_ind + uVar9;
        uVar14 = *puVar2;
        if (uVar14 == uVar18) {
          if (NAN(Xc[uVar9])) {
            uVar14 = ix_arr[sVar10];
            ix_arr[sVar10] = uVar18;
            *puVar6 = uVar14;
            sVar10 = sVar10 + 1;
          }
          if ((puVar6 == puVar1) || (uVar9 == uVar13)) break;
          puVar5 = puVar2 + 1;
          puVar6 = puVar6 + 1;
          uVar9 = (long)((long)Xc_ind + (uVar3 * 8 - (long)puVar5)) >> 3;
          if (0 < (long)uVar9) {
            do {
              uVar14 = uVar9 >> 1;
              uVar18 = ~uVar14 + uVar9;
              uVar9 = uVar14;
              if (puVar5[uVar14] < *puVar6) {
                puVar5 = puVar5 + uVar14 + 1;
                uVar9 = uVar18;
              }
            } while (0 < (long)uVar9);
          }
LAB_002efb6d:
          uVar9 = (long)puVar5 - (long)Xc_ind >> 3;
        }
        else {
          if (uVar14 <= uVar18) {
            puVar5 = puVar2 + 1;
            uVar9 = (long)((long)Xc_ind + (uVar3 * 8 - (long)(puVar2 + 1))) >> 3;
            while (0 < (long)uVar9) {
              uVar15 = uVar9 >> 1;
              uVar14 = ~uVar15 + uVar9;
              uVar9 = uVar15;
              if (puVar5[uVar15] < uVar18) {
                puVar5 = puVar5 + uVar15 + 1;
                uVar9 = uVar14;
              }
            }
            goto LAB_002efb6d;
          }
          puVar6 = puVar6 + 1;
          uVar18 = (long)puVar12 - (long)puVar6 >> 3;
          while (0 < (long)uVar18) {
            uVar15 = uVar18 >> 1;
            uVar11 = ~uVar15 + uVar18;
            uVar18 = uVar15;
            if ((puVar6 + uVar15 + 1)[-1] < uVar14) {
              puVar6 = puVar6 + uVar15 + 1;
              uVar18 = uVar11;
            }
          }
        }
        if ((puVar6 == puVar12) || (uVar9 == uVar3)) break;
      }
    }
  }
  *end_NA = sVar10;
  return;
LAB_002ef69d:
  for (; puVar6 <= puVar1; puVar6 = puVar6 + 1) {
    uVar18 = ix_arr[sVar10];
    ix_arr[sVar10] = *puVar6;
    *puVar6 = uVar18;
    sVar10 = sVar10 + 1;
  }
  goto LAB_002ef846;
LAB_002ef824:
  for (; puVar6 <= puVar1; puVar6 = puVar6 + 1) {
    uVar9 = ix_arr[sVar10];
    ix_arr[sVar10] = *puVar6;
    *puVar6 = uVar9;
    sVar10 = sVar10 + 1;
  }
LAB_002ef8d1:
  *split_ix = sVar10;
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                         real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr, double split_point,
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    /* TODO: this is a mess, needs refactoring */
    /* TODO: when moving zeros, would be better to instead move by '>' (opposite as in here) */
    /* TODO: should create an extra version to go along with 'predict' that would
       add the range penalty right here to spare operations. */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        if (missing_action == Fail)
        {
            split_ix = (0 <= split_point)? (end+1) : st;
        }

        else
        {
            st_NA  = (0 <= split_point)? (end+1) : st;
            end_NA = (0 <= split_point)? (end+1) : st;
        }

    }

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t temp;
    bool   move_zeros = 0 <= split_point;
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    if (move_zeros && ptr_st > ix_arr + st)
        st = ptr_st - ix_arr;

    if (missing_action == Fail)
    {
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                    {
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        split_ix = st;
    }

    else /* can have NAs */
    {

        bool has_NAs = false;
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                        has_NAs = true;
                    else if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                    {
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                    }
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos]))) has_NAs = true;
                    if (!std::isnan(Xc[curr_pos]) && Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }


        st_NA = st;
        if (has_NAs)
        {
            curr_pos = st_col;
            std::sort(ix_arr + st, ix_arr + end + 1);
            for (size_t *row = ix_arr + st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }
        end_NA = st;

    }

}